

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O0

ON_SubD * ON_SubD::CreateFromMesh
                    (ON_Mesh *level_zero_mesh,ON_SubDFromMeshParameters *from_mesh_options,
                    ON_SubD *subd)

{
  undefined8 this;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON_MeshNgon *ngon_00;
  ON_Mesh *this_00;
  uint *ngon_index_list;
  ON_SubD *pOVar4;
  ON_SubD *subd_from_mesh;
  uint removed_count;
  ON_MeshNgon *ngon;
  undefined1 local_8b0 [4];
  uint ni;
  ON_SimpleArray<unsigned_int> ngons_with_holes;
  uint ngon_count;
  bool bMustBeOrientedNgon;
  ON_NgonBoundaryChecker bc;
  ON_Mesh *local_copy;
  ON_SubD *subd_local;
  ON_SubDFromMeshParameters *from_mesh_options_local;
  ON_Mesh *level_zero_mesh_local;
  
  bc.m_bIsSimple = false;
  bc.m_bIsNotSimple = false;
  bc._2130_6_ = 0;
  from_mesh_options_local = (ON_SubDFromMeshParameters *)level_zero_mesh;
  if (level_zero_mesh != (ON_Mesh *)0x0) {
    ON_NgonBoundaryChecker::ON_NgonBoundaryChecker((ON_NgonBoundaryChecker *)&ngon_count);
    uVar2 = ON_Mesh::NgonUnsignedCount(level_zero_mesh);
    ON_SimpleArray<unsigned_int>::ON_SimpleArray
              ((ON_SimpleArray<unsigned_int> *)local_8b0,(ulong)uVar2);
    for (ngon._4_4_ = 0; ngon._4_4_ < uVar2; ngon._4_4_ = ngon._4_4_ + 1) {
      ngon_00 = ON_Mesh::Ngon(level_zero_mesh,ngon._4_4_);
      if ((((ngon_00 != (ON_MeshNgon *)0x0) && (2 < ngon_00->m_Vcount)) && (1 < ngon_00->m_Fcount))
         && (bVar1 = ON_NgonBoundaryChecker::IsSimpleNgon
                               ((ON_NgonBoundaryChecker *)&ngon_count,ngon_00,level_zero_mesh,false)
            , !bVar1)) {
        ON_SimpleArray<unsigned_int>::Append
                  ((ON_SimpleArray<unsigned_int> *)local_8b0,(uint *)((long)&ngon + 4));
      }
    }
    uVar3 = ON_SimpleArray<unsigned_int>::UnsignedCount((ON_SimpleArray<unsigned_int> *)local_8b0);
    if (uVar3 != 0) {
      this_00 = (ON_Mesh *)operator_new(0x6e0);
      ON_Mesh::ON_Mesh(this_00,level_zero_mesh);
      bc._2128_8_ = this_00;
      if ((this_00 != (ON_Mesh *)0x0) &&
         (uVar3 = ON_Mesh::NgonUnsignedCount(this_00), this = bc._2128_8_, uVar2 == uVar3)) {
        uVar2 = ON_SimpleArray<unsigned_int>::UnsignedCount
                          ((ON_SimpleArray<unsigned_int> *)local_8b0);
        ngon_index_list =
             ON_SimpleArray<unsigned_int>::Array((ON_SimpleArray<unsigned_int> *)local_8b0);
        uVar2 = ON_Mesh::RemoveNgons((ON_Mesh *)this,uVar2,ngon_index_list);
        if (uVar2 != 0) {
          from_mesh_options_local = (ON_SubDFromMeshParameters *)bc._2128_8_;
        }
      }
    }
    ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)local_8b0);
    ON_NgonBoundaryChecker::~ON_NgonBoundaryChecker((ON_NgonBoundaryChecker *)&ngon_count);
  }
  pOVar4 = Internal_CreateFromMeshWithValidNgons
                     ((ON_Mesh *)from_mesh_options_local,from_mesh_options,subd);
  if ((bc._2128_8_ != 0) && (bc._2128_8_ != 0)) {
    (**(code **)(*(long *)bc._2128_8_ + 0x20))();
  }
  return pOVar4;
}

Assistant:

ON_SubD* ON_SubD::CreateFromMesh(
  const class ON_Mesh* level_zero_mesh,
  const class ON_SubDFromMeshParameters* from_mesh_options,
  ON_SubD* subd
)
{
  ON_Mesh* local_copy = nullptr;
  if (nullptr != level_zero_mesh)
  {
    // remove ngons with holes and other damaged ngons so the underlying faces get used.

    ON_NgonBoundaryChecker bc;
    const bool bMustBeOrientedNgon = false;

    const unsigned ngon_count = level_zero_mesh->NgonUnsignedCount();
    ON_SimpleArray<unsigned> ngons_with_holes(ngon_count);
    for (unsigned ni = 0; ni < ngon_count; ++ni)
    {
      const class ON_MeshNgon* ngon = level_zero_mesh->Ngon(ni);
      if ( nullptr == ngon)
        continue;
      if (ngon->m_Vcount < 3 || ngon->m_Fcount <= 1)
        continue;
      if ( false == bc.IsSimpleNgon(ngon, level_zero_mesh,bMustBeOrientedNgon) )
        ngons_with_holes.Append(ni);
    }

    for (;;)
    {
      if (0 == ngons_with_holes.UnsignedCount())
        break;
      local_copy = new ON_Mesh(*level_zero_mesh);
      if (nullptr == local_copy)
        break;
      if (ngon_count != local_copy->NgonUnsignedCount())
        break;
      const unsigned removed_count = local_copy->RemoveNgons(ngons_with_holes.UnsignedCount(), ngons_with_holes.Array());
      if (removed_count > 0)
        level_zero_mesh = local_copy;
      break;
    }
  }

  ON_SubD* subd_from_mesh = Internal_CreateFromMeshWithValidNgons(level_zero_mesh, from_mesh_options, subd);
  if (nullptr != local_copy)
    delete local_copy;
  return subd_from_mesh;
}